

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O2

unique_ptr<vm::VM,_std::default_delete<vm::VM>_> __thiscall vm::VM::make_vm(VM *this,File *file)

{
  pointer pFVar1;
  bool bVar2;
  long lVar3;
  reference pvVar4;
  variant_alternative_t<0UL,_variant<basic_string<char>,_int,_double>_> *__lhs;
  pointer piVar5;
  InvalidFile *pIVar6;
  pointer pFVar7;
  uint uVar8;
  ulong __n;
  pointer __p;
  __single_object vm;
  __uniq_ptr_impl<int,_std::default_delete<int[]>_> local_98;
  string local_90;
  string local_70;
  string local_50;
  
  pFVar7 = (file->functions).super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl
           .super__Vector_impl_data._M_start;
  pFVar1 = (file->functions).super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl
           .super__Vector_impl_data._M_finish;
  uVar8 = 0;
  do {
    if (pFVar7 == pFVar1) {
LAB_00114426:
      if ((long)(file->functions).super__Vector_base<vm::Function,_std::allocator<vm::Function>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(file->functions).super__Vector_base<vm::Function,_std::allocator<vm::Function>_>.
                _M_impl.super__Vector_impl_data._M_start >> 5 != (ulong)uVar8) {
        std::make_unique<vm::VM,File>((File *)&vm);
        piVar5 = (pointer)operator_new__(0x3fffffc);
        memset(piVar5,0,0x3fffffc);
        local_98._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
        super__Head_base<0UL,_int_*,_false>._M_head_impl =
             (tuple<int_*,_std::default_delete<int[]>_>)
             (_Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>)0x0;
        std::__uniq_ptr_impl<int,_std::default_delete<int[]>_>::reset
                  ((__uniq_ptr_impl<int,_std::default_delete<int[]>_> *)
                   ((long)vm._M_t.super___uniq_ptr_impl<vm::VM,_std::default_delete<vm::VM>_>._M_t.
                          super__Tuple_impl<0UL,_vm::VM_*,_std::default_delete<vm::VM>_>.
                          super__Head_base<0UL,_vm::VM_*,_false>._M_head_impl + 0x58),piVar5);
        std::unique_ptr<int[],_std::default_delete<int[]>_>::~unique_ptr
                  ((unique_ptr<int[],_std::default_delete<int[]>_> *)&local_98);
        piVar5 = (pointer)operator_new__(0x3fffffc);
        memset(piVar5,0,0x3fffffc);
        local_98._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
        super__Head_base<0UL,_int_*,_false>._M_head_impl =
             (tuple<int_*,_std::default_delete<int[]>_>)
             (_Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>)0x0;
        std::__uniq_ptr_impl<int,_std::default_delete<int[]>_>::reset
                  ((__uniq_ptr_impl<int,_std::default_delete<int[]>_> *)
                   ((long)vm._M_t.super___uniq_ptr_impl<vm::VM,_std::default_delete<vm::VM>_>._M_t.
                          super__Tuple_impl<0UL,_vm::VM_*,_std::default_delete<vm::VM>_>.
                          super__Head_base<0UL,_vm::VM_*,_false>._M_head_impl + 0x60),piVar5);
        std::unique_ptr<int[],_std::default_delete<int[]>_>::~unique_ptr
                  ((unique_ptr<int[],_std::default_delete<int[]>_> *)&local_98);
        *(__uniq_ptr_data<vm::VM,_std::default_delete<vm::VM>,_true,_true> *)this =
             vm._M_t.super___uniq_ptr_impl<vm::VM,_std::default_delete<vm::VM>_>._M_t.
             super__Tuple_impl<0UL,_vm::VM_*,_std::default_delete<vm::VM>_>.
             super__Head_base<0UL,_vm::VM_*,_false>._M_head_impl;
        vm._M_t.super___uniq_ptr_impl<vm::VM,_std::default_delete<vm::VM>_>._M_t.
        super__Tuple_impl<0UL,_vm::VM_*,_std::default_delete<vm::VM>_>.
        super__Head_base<0UL,_vm::VM_*,_false>._M_head_impl =
             (__uniq_ptr_data<vm::VM,_std::default_delete<vm::VM>,_true,_true>)
             (__uniq_ptr_impl<vm::VM,_std::default_delete<vm::VM>_>)0x0;
        std::unique_ptr<vm::VM,_std::default_delete<vm::VM>_>::~unique_ptr(&vm);
        return (__uniq_ptr_data<vm::VM,_std::default_delete<vm::VM>,_true,_true>)
               (__uniq_ptr_data<vm::VM,_std::default_delete<vm::VM>,_true,_true>)this;
      }
      pIVar6 = (InvalidFile *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,"main not found",(allocator<char> *)&vm);
      InvalidFile::InvalidFile(pIVar6,&local_90);
      __cxa_throw(pIVar6,&InvalidFile::typeinfo,InvalidFile::~InvalidFile);
    }
    __n = (ulong)pFVar7->nameIndex;
    lVar3 = (long)(file->constants).super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(file->constants).super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(lVar3 / 0x30) <= __n) {
      pIVar6 = (InvalidFile *)__cxa_allocate_exception(0x28,__n,lVar3 % 0x30);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"function name index out of range",(allocator<char> *)&vm);
      InvalidFile::InvalidFile(pIVar6,&local_50);
      __cxa_throw(pIVar6,&InvalidFile::typeinfo,InvalidFile::~InvalidFile);
    }
    pvVar4 = std::vector<vm::Constant,_std::allocator<vm::Constant>_>::at(&file->constants,__n);
    if (pvVar4->type != STRING) {
      pIVar6 = (InvalidFile *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"function name not found",(allocator<char> *)&vm);
      InvalidFile::InvalidFile(pIVar6,&local_70);
      __cxa_throw(pIVar6,&InvalidFile::typeinfo,InvalidFile::~InvalidFile);
    }
    __lhs = std::get<0ul,std::__cxx11::string,int,double>(&pvVar4->value);
    bVar2 = std::operator==(__lhs,"main");
    if (bVar2) {
      vm._M_t.super___uniq_ptr_impl<vm::VM,_std::default_delete<vm::VM>_>._M_t.
      super__Tuple_impl<0UL,_vm::VM_*,_std::default_delete<vm::VM>_>.
      super__Head_base<0UL,_vm::VM_*,_false>._M_head_impl._0_1_ = 0xc;
      vm._M_t.super___uniq_ptr_impl<vm::VM,_std::default_delete<vm::VM>_>._M_t.
      super__Tuple_impl<0UL,_vm::VM_*,_std::default_delete<vm::VM>_>.
      super__Head_base<0UL,_vm::VM_*,_false>._M_head_impl._4_2_ = pFVar7->paramSize;
      vm._M_t.super___uniq_ptr_impl<vm::VM,_std::default_delete<vm::VM>_>._M_t.
      super__Tuple_impl<0UL,_vm::VM_*,_std::default_delete<vm::VM>_>.
      super__Head_base<0UL,_vm::VM_*,_false>._M_head_impl._6_2_ = 0;
      std::vector<vm::Instruction,_std::allocator<vm::Instruction>_>::emplace_back<vm::Instruction>
                (&file->start,(Instruction *)&vm);
      vm._M_t.super___uniq_ptr_impl<vm::VM,_std::default_delete<vm::VM>_>._M_t.
      super__Tuple_impl<0UL,_vm::VM_*,_std::default_delete<vm::VM>_>.
      super__Head_base<0UL,_vm::VM_*,_false>._M_head_impl._0_1_ = 0x80;
      vm._M_t.super___uniq_ptr_impl<vm::VM,_std::default_delete<vm::VM>_>._M_t.
      super__Tuple_impl<0UL,_vm::VM_*,_std::default_delete<vm::VM>_>.
      super__Head_base<0UL,_vm::VM_*,_false>._M_head_impl._4_4_ = uVar8;
      std::vector<vm::Instruction,_std::allocator<vm::Instruction>_>::emplace_back<vm::Instruction>
                (&file->start,(Instruction *)&vm);
      goto LAB_00114426;
    }
    uVar8 = uVar8 + 1;
    pFVar7 = pFVar7 + 1;
  } while( true );
}

Assistant:

std::unique_ptr<VM> VM::make_vm(File file) {
    // found main function
    vm::u4 mainIndex = 0;
    bool mainFound = false;
    for (auto& fun : file.functions) {
        if (0 > fun.nameIndex || fun.nameIndex >= file.constants.size()) {
            throw InvalidFile("function name index out of range");
        }
        if (auto& constant = file.constants.at(fun.nameIndex); constant.type == vm::Constant::Type::STRING) {
            if (std::get<vm::str_t>(constant.value) == "main") {
                file.start.push_back(Instruction{OpCode::snew, fun.paramSize});
                file.start.push_back(Instruction{OpCode::call, mainIndex});
                break;
            }
        }
        else {
            throw InvalidFile("function name not found");
        }
        ++mainIndex;
    }
    if (mainIndex == file.functions.size()) {
        throw InvalidFile("main not found");
    }
    auto vm = std::make_unique<VM>(std::move(file));
    vm->_stack = std::make_unique<slot_t[]>(MAX_STACK_ADDR-MIN_STACK_ADDR);
    vm->_heap  = std::make_unique<slot_t[]>(MAX_HEAP_ADDR-MIN_HEAP_ADDR);
    return std::move(vm);
}